

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_map.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  _Setw _Var2;
  const_iterator cVar3;
  const_iterator cVar4;
  iterator iVar5;
  _Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  tt_00;
  pointer ppVar6;
  ulong uVar7;
  ostream *poVar8;
  uint64_t uVar9;
  size_type sVar10;
  reference ppVar11;
  ostream *poVar12;
  _Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
  *this;
  pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_> *p;
  iterator __end1;
  iterator __begin1;
  truth_table_map *__range1;
  iterator it;
  static_truth_table<4U,_true> spectral;
  __tuple_element_t<0UL,_tuple<static_truth_table<4U,_true>,_unsigned_int,_vector<unsigned_char,_allocator<unsigned_char>_>_>_>
  f_npn;
  uint func_count;
  int bctr;
  int ctr;
  truth_table tt;
  int64_t index;
  truth_table_map classes;
  dynamic_truth_table map;
  dynamic_truth_table *in_stack_fffffffffffffdf8;
  unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffe00;
  long *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  ostream *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  _Setw in_stack_fffffffffffffe34;
  ostream *in_stack_fffffffffffffe38;
  mapped_type *in_stack_fffffffffffffe80;
  _Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_140;
  _Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_138;
  undefined1 *local_130;
  uint local_124;
  pair<unsigned_long,_unsigned_long> local_120;
  _Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_110;
  _Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_108;
  uint64_t local_100;
  dynamic_truth_table *local_f8;
  _func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
  *fn;
  static_truth_table<4U,_true> *in_stack_ffffffffffffff18;
  uint local_b4 [3];
  static_truth_table<4U,_true> local_a8;
  long local_a0;
  undefined1 local_98 [40];
  anon_class_16_2_3cabdf2f *in_stack_ffffffffffffff90;
  static_truth_table<4U,_true> *in_stack_ffffffffffffff98;
  dynamic_truth_table local_28;
  int local_4;
  
  local_4 = 0;
  kitty::dynamic_truth_table::dynamic_truth_table
            ((dynamic_truth_table *)
             CONCAT44(in_stack_fffffffffffffe34._M_n,in_stack_fffffffffffffe30),
             (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  cVar3 = kitty::dynamic_truth_table::cbegin(in_stack_fffffffffffffdf8);
  cVar4 = kitty::dynamic_truth_table::cend(in_stack_fffffffffffffdf8);
  iVar5 = kitty::dynamic_truth_table::begin(in_stack_fffffffffffffdf8);
  std::
  transform<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,main::__0>
            (cVar3._M_current,cVar4._M_current,iVar5._M_current);
  std::
  unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::unordered_map((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)0x11a94f);
  local_a0 = 0;
  kitty::static_truth_table<4U,_true>::static_truth_table(&local_a8);
  local_b4[2] = 0;
  local_b4[1] = 0;
  while (local_a0 != -1) {
    kitty::create_from_words<kitty::static_truth_table<4u,true>,long*>
              ((static_truth_table<4U,_true> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,(long *)in_stack_fffffffffffffe00);
    local_b4[0] = 0;
    local_f8 = &local_28;
    fn = (_func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
          *)local_b4;
    kitty::exact_npn_canonization<kitty::static_truth_table<4u,true>,main::__1>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::
    get<0ul,kitty::static_truth_table<4u,true>,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x11aa0b);
    std::
    tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~tuple((tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x11aa23);
    local_100 = (uint64_t)
                kitty::
                exact_spectral_canonization<kitty::static_truth_table<4u,true>,void(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
                          (in_stack_ffffffffffffff18,fn);
    tt_00._M_cur = (__node_type *)
                   std::
                   unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   ::find((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                           *)in_stack_fffffffffffffdf8,(key_type *)0x11aa66);
    local_108._M_cur = tt_00._M_cur;
    local_110._M_cur =
         (__node_type *)
         std::
         unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::end((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)in_stack_fffffffffffffdf8);
    bVar1 = std::__detail::operator==(&local_108,&local_110);
    if (bVar1) {
      local_124 = 1;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_int,_unsigned_int_&,_true>
                (&local_120,&local_124,local_b4);
      in_stack_fffffffffffffe80 =
           std::
           unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::operator[](in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
      std::pair<unsigned_long,_unsigned_long>::operator=(in_stack_fffffffffffffe80,&local_120);
    }
    else {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                             *)0x11ab62);
      (ppVar6->second).first = (ppVar6->second).first + 1;
      uVar7 = (ulong)local_b4[0];
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                             *)0x11ab8a);
      (ppVar6->second).second = uVar7 + (ppVar6->second).second;
    }
    local_a0 = kitty::find_first_one_bit<kitty::dynamic_truth_table>
                         ((dynamic_truth_table *)tt_00._M_cur,(int64_t)in_stack_fffffffffffffe80);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"[i] enumerated ");
  uVar9 = kitty::dynamic_truth_table::num_bits(&local_28);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar9);
  poVar8 = std::operator<<(poVar8," functions into ");
  sVar10 = std::
           unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::size((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)0x11ac28);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar10);
  poVar8 = std::operator<<(poVar8," classes.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,"[i] detailed classes:");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  local_130 = local_98;
  local_138._M_cur =
       (__node_type *)
       std::
       unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::begin((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)in_stack_fffffffffffffdf8);
  local_140._M_cur =
       (__node_type *)
       std::
       unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::end((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_138,&local_140);
    if (!bVar1) break;
    ppVar11 = std::__detail::
              _Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
              ::operator*((_Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                           *)0x11acf9);
    kitty::print_hex<kitty::static_truth_table<4u,true>,void>
              ((static_truth_table<4U,_true> *)
               CONCAT44(in_stack_fffffffffffffe34._M_n,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
    std::operator<<((ostream *)&std::cout,"   ");
    kitty::print_spectrum<kitty::static_truth_table<4u,true>>
              ((static_truth_table<4U,_true> *)poVar8,in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe38 = std::operator<<((ostream *)&std::cout," ");
    in_stack_fffffffffffffe34 = std::setw(8);
    in_stack_fffffffffffffe28 = std::operator<<(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34)
    ;
    poVar12 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe28,(ppVar11->second).first)
    ;
    poVar12 = std::operator<<(poVar12," ");
    _Var2 = std::setw(8);
    poVar12 = std::operator<<(poVar12,_Var2);
    this = (_Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
            *)std::ostream::operator<<(poVar12,(ppVar11->second).second);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__detail::
    _Node_iterator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
    ::operator++(this);
  }
  local_4 = 0;
  std::
  unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~unordered_map((unordered_map<kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)0x11ae53);
  kitty::dynamic_truth_table::~dynamic_truth_table((dynamic_truth_table *)0x11ae60);
  return local_4;
}

Assistant:

int main()
{
  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* set to store all visited functions during NPN canonization (dynamic to store bits on heap) */
  kitty::dynamic_truth_table map( truth_table::NumBits );

  /* invert bits: 1 means not classified yet */
  std::transform( map.cbegin(), map.cend(), map.begin(), []( auto word ) { return ~word; } );

  /* set to store all NPN and spectral representatives */
  using truth_table_map = std::unordered_map<truth_table, std::pair<uint64_t, uint64_t>, kitty::hash<truth_table>>;
  truth_table_map classes;

  /* start from 0 */
  int64_t index = 0;
  truth_table tt;

  /* for counting the classes and functions */
  //uint64_t ones = map.num_bits();

  auto ctr = 0, bctr = 0;

  while ( index != -1 )
  {
    /* create truth table from index value */
    kitty::create_from_words( tt, &index, &index + 1 );

    /* apply NPN canonization and add resulting representative to set;
       also cross out all the visited functions */
    auto func_count = 0u;
    const auto f_npn = std::get<0>( kitty::exact_npn_canonization( tt,
                                                                   [&map, &func_count]( const auto& tt ) {
                                                                     func_count += kitty::get_bit( map, *tt.cbegin() );
                                                                     kitty::clear_bit( map, *tt.cbegin() ); } ) );

    //auto new_ones = count_ones( map );
    //auto func_count = ones - new_ones;
    //ones = new_ones;

    const auto spectral = kitty::exact_spectral_canonization( f_npn );

    auto it = classes.find( spectral );

    if ( it == classes.end() )
    {
      classes[spectral] = {1u, func_count};
    }
    else
    {
      it->second.first++;
      it->second.second += func_count;
    }

    if ( progress )
    {
      std::cout << ".";

      if ( ++ctr == 100 )
      {
        std::cout << " " << ++bctr << std::endl;
        ctr = 0;
      }
    }

    /* find next non-classified truth table */
    index = find_first_one_bit( map, index );
  }

  if ( progress )
  {
    std::cout << std::endl;
  }

  std::cout << "[i] enumerated "
            << map.num_bits() << " functions into "
            << classes.size() << " classes." << std::endl;

  std::cout << "[i] detailed classes:" << std::endl;

  for ( const auto& p : classes )
  {
    print_hex( p.first );
    std::cout << "   ";
    print_spectrum( p.first );
    std::cout << " " << std::setw( 8 ) << p.second.first << " " << std::setw( 8 ) << p.second.second << std::endl;
  }

  return 0;
}